

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyBuildItem(Scl_Tree_t *p,char **ppPos,char *pEnd)

{
  uint uVar1;
  char *pcVar2;
  Scl_Pair_t SVar3;
  Scl_Pair_t Head_00;
  Scl_Pair_t Head_01;
  Scl_Pair_t Head_02;
  Scl_Pair_t SVar4;
  Scl_Pair_t SVar5;
  Scl_Pair_t SVar6;
  Scl_Pair_t SVar7;
  Scl_Pair_t Pair;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Scl_Item_t *pSVar12;
  Scl_Pair_t SVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pStop;
  char *pNext;
  Scl_Pair_t Body;
  Scl_Pair_t Head;
  Scl_Pair_t Key;
  Scl_Item_t *pItem;
  char *pEnd_local;
  char **ppPos_local;
  Scl_Tree_t *p_local;
  
  Head.End = 0;
  iVar8 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
  if (iVar8 != 0) {
    return -2;
  }
  iVar8 = (int)*ppPos - (int)p->pContents;
  iVar9 = Scl_LibertySkipEntry(ppPos,pEnd);
  if (iVar9 == 0) {
    Head.End = (int)*ppPos - (int)p->pContents;
    iVar9 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar9 == 0) {
      pcVar16 = *ppPos;
      if (*pcVar16 == ':') {
        *ppPos = pcVar16 + 1;
        iVar9 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
        if (iVar9 == 0) {
          pcVar16 = *ppPos;
          pcVar14 = p->pContents;
          iVar9 = Scl_LibertySkipEntry(ppPos,pEnd);
          if (iVar9 == 0) {
            pcVar17 = *ppPos;
            pcVar15 = p->pContents;
            iVar9 = Scl_LibertySkipSpaces(p,ppPos,pEnd,1);
            if ((iVar9 == 0) && ((pcVar2 = *ppPos, *pcVar2 == ';' || (*pcVar2 == '\n')))) {
              *ppPos = pcVar2 + 1;
              pSVar12 = Scl_LibertyNewItem(p,2);
              SVar4.End = Head.End;
              SVar4.Beg = iVar8;
              pSVar12->Key = SVar4;
              Head_00.End = (int)pcVar17 - (int)pcVar15;
              Head_00.Beg = (int)pcVar16 - (int)pcVar14;
              SVar13 = Scl_LibertyUpdateHead(p,Head_00);
              pSVar12->Head = SVar13;
              iVar9 = Scl_LibertyBuildItem(p,ppPos,pEnd);
              pSVar12->Next = iVar9;
              if (pSVar12->Next != -1) {
                iVar8 = Scl_LibertyItemId(p,pSVar12);
                return iVar8;
              }
            }
          }
        }
      }
      else if (*pcVar16 == '(') {
        pcVar14 = Scl_LibertyFindMatch(pcVar16,pEnd);
        iVar9 = ((int)pcVar16 - (int)p->pContents) + 1;
        iVar10 = (int)pcVar14 - (int)p->pContents;
        *ppPos = pcVar14 + 1;
        iVar11 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
        if (iVar11 != 0) {
          pSVar12 = Scl_LibertyNewItem(p,3);
          SVar5.End = Head.End;
          SVar5.Beg = iVar8;
          pSVar12->Key = SVar5;
          SVar13.End = iVar10;
          SVar13.Beg = iVar9;
          SVar13 = Scl_LibertyUpdateHead(p,SVar13);
          pSVar12->Head = SVar13;
          iVar8 = Scl_LibertyItemId(p,pSVar12);
          return iVar8;
        }
        pcVar16 = *ppPos;
        if (*pcVar16 == '{') {
          pcVar15 = Scl_LibertyFindMatch(pcVar16,pEnd);
          pcVar14 = p->pContents;
          pcVar17 = p->pContents;
          pSVar12 = Scl_LibertyNewItem(p,1);
          SVar6.End = Head.End;
          SVar6.Beg = iVar8;
          pSVar12->Key = SVar6;
          Head_01.End = iVar10;
          Head_01.Beg = iVar9;
          SVar13 = Scl_LibertyUpdateHead(p,Head_01);
          pSVar12->Head = SVar13;
          SVar3.End = (int)pcVar15 - (int)pcVar17;
          SVar3.Beg = ((int)pcVar16 - (int)pcVar14) + 1;
          pSVar12->Body = SVar3;
          *ppPos = pcVar16 + 1;
          iVar9 = Scl_LibertyBuildItem(p,ppPos,pcVar15);
          pSVar12->Child = iVar9;
          if (pSVar12->Child != -1) {
            *ppPos = pcVar15 + 1;
            iVar9 = Scl_LibertyBuildItem(p,ppPos,pEnd);
            pSVar12->Next = iVar9;
            if (pSVar12->Next != -1) {
              iVar8 = Scl_LibertyItemId(p,pSVar12);
              return iVar8;
            }
          }
        }
        else {
          if (*pcVar16 == ';') {
            *ppPos = pcVar16 + 1;
          }
          pSVar12 = Scl_LibertyNewItem(p,3);
          SVar7.End = Head.End;
          SVar7.Beg = iVar8;
          pSVar12->Key = SVar7;
          Head_02.End = iVar10;
          Head_02.Beg = iVar9;
          SVar13 = Scl_LibertyUpdateHead(p,Head_02);
          pSVar12->Head = SVar13;
          iVar9 = Scl_LibertyBuildItem(p,ppPos,pEnd);
          pSVar12->Next = iVar9;
          if (pSVar12->Next != -1) {
            iVar8 = Scl_LibertyItemId(p,pSVar12);
            return iVar8;
          }
        }
      }
      else if (*pcVar16 == ';') {
        *ppPos = pcVar16 + 1;
        iVar8 = Scl_LibertyBuildItem(p,ppPos,pEnd);
        return iVar8;
      }
    }
  }
  if (p->pError == (char *)0x0) {
    pcVar16 = (char *)malloc(1000);
    p->pError = pcVar16;
    pcVar16 = p->pError;
    pcVar14 = p->pFileName;
    uVar1 = p->nLines;
    Pair.End = Head.End;
    Pair.Beg = iVar8;
    pcVar17 = Scl_LibertyReadString(p,Pair);
    sprintf(pcVar16,"File \"%s\". Line %6d. Failed to parse entry \"%s\".\n",pcVar14,(ulong)uVar1,
            pcVar17);
  }
  return -1;
}

Assistant:

int Scl_LibertyBuildItem( Scl_Tree_t * p, char ** ppPos, char * pEnd )
{
    Scl_Item_t * pItem;
    Scl_Pair_t Key, Head, Body;
    char * pNext, * pStop;
    Key.End = 0;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        return -2;
    Key.Beg = *ppPos - p->pContents;
    if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
        goto exit;
    Key.End = *ppPos - p->pContents;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        goto exit;
    pNext = *ppPos;
    if ( *pNext == ':' )
    {
        *ppPos = pNext + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
            goto exit;
        Head.Beg = *ppPos - p->pContents;
        if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
            goto exit;
        Head.End = *ppPos - p->pContents;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 1 ) )
            goto exit;
        pNext = *ppPos;
        if ( *pNext != ';' && *pNext != '\n' )
            goto exit;
        *ppPos = pNext + 1;
        // end of equation
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_EQUA );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == '(' )
    {
        pStop = Scl_LibertyFindMatch( pNext, pEnd );
        Head.Beg = pNext - p->pContents + 1;
        Head.End = pStop - p->pContents;
        *ppPos = pStop + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        {
            // end of list
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            return Scl_LibertyItemId( p, pItem );
        }
        pNext = *ppPos;
        if ( *pNext == '{' ) // beginning of body
        {
            pStop = Scl_LibertyFindMatch( pNext, pEnd );
            Body.Beg = pNext - p->pContents + 1;
            Body.End = pStop - p->pContents;
            // end of body
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_PROC );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            pItem->Body = Body;
            *ppPos = pNext + 1;
            pItem->Child = Scl_LibertyBuildItem( p, ppPos, pStop );
            if ( pItem->Child == -1 )
                goto exit;
            *ppPos = pStop + 1;
            pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
            if ( pItem->Next == -1 )
                goto exit;
            return Scl_LibertyItemId( p, pItem );
        }
        // end of list
        if ( *pNext == ';' )
            *ppPos = pNext + 1;
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == ';' )
    {
        *ppPos = pNext + 1;
        return Scl_LibertyBuildItem(p, ppPos, pEnd);
    }
exit:
    if ( p->pError == NULL )
    {
        p->pError = ABC_ALLOC( char, 1000 );
        sprintf( p->pError, "File \"%s\". Line %6d. Failed to parse entry \"%s\".\n", 
            p->pFileName, p->nLines, Scl_LibertyReadString(p, Key) );
    }
    return -1;
}